

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aecm_core.cc
# Opt level: O1

int16_t WebRtcAecm_CalcSuppressionGain(AecmCore *aecm)

{
  undefined2 uVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  int32_t iVar5;
  
  if (aecm->currentVADValue == 0) {
    sVar3 = 0;
  }
  else {
    sVar2 = aecm->nearLogEnergy[0] - aecm->echoStoredLogEnergy[0];
    sVar3 = -sVar2;
    if (0 < sVar2) {
      sVar3 = sVar2;
    }
    iVar4 = (int)sVar3;
    if (iVar4 < 400) {
      if (iVar4 < 200) {
        iVar5 = WebRtcSpl_DivW32W16(aecm->supGainErrParamDiffAB * iVar4 + 100,200);
        sVar3 = aecm->supGainErrParamA - (short)iVar5;
      }
      else {
        iVar5 = WebRtcSpl_DivW32W16((400 - iVar4) * (int)aecm->supGainErrParamDiffBD + 100,200);
        sVar3 = (short)iVar5 + aecm->supGainErrParamD;
      }
    }
    else {
      sVar3 = aecm->supGainErrParamD;
    }
  }
  uVar1 = aecm->supGainOld;
  sVar2 = sVar3;
  if (sVar3 <= (short)uVar1) {
    sVar2 = uVar1;
  }
  aecm->supGainOld = sVar3;
  sVar3 = (short)((uint)((int)sVar2 - (int)aecm->supGain) >> 4) + aecm->supGain;
  aecm->supGain = sVar3;
  return sVar3;
}

Assistant:

int16_t WebRtcAecm_CalcSuppressionGain(AecmCore* const aecm) {
    int32_t tmp32no1;

    int16_t supGain = SUPGAIN_DEFAULT;
    int16_t tmp16no1;
    int16_t dE = 0;

    // Determine suppression gain used in the Wiener filter. The gain is based on a mix of far
    // end energy and echo estimation error.
    // Adjust for the far end signal level. A low signal level indicates no far end signal,
    // hence we set the suppression gain to 0
    if (!aecm->currentVADValue)
    {
        supGain = 0;
    } else
    {
        // Adjust for possible double talk. If we have large variations in estimation error we
        // likely have double talk (or poor channel).
        tmp16no1 = (aecm->nearLogEnergy[0] - aecm->echoStoredLogEnergy[0] - ENERGY_DEV_OFFSET);
        dE = WEBRTC_SPL_ABS_W16(tmp16no1);

        if (dE < ENERGY_DEV_TOL)
        {
            // Likely no double talk. The better estimation, the more we can suppress signal.
            // Update counters
            if (dE < SUPGAIN_EPC_DT)
            {
                tmp32no1 = aecm->supGainErrParamDiffAB * dE;
                tmp32no1 += (SUPGAIN_EPC_DT >> 1);
                tmp16no1 = (int16_t)WebRtcSpl_DivW32W16(tmp32no1, SUPGAIN_EPC_DT);
                supGain = aecm->supGainErrParamA - tmp16no1;
            } else
            {
                tmp32no1 = aecm->supGainErrParamDiffBD * (ENERGY_DEV_TOL - dE);
                tmp32no1 += ((ENERGY_DEV_TOL - SUPGAIN_EPC_DT) >> 1);
                tmp16no1 = (int16_t)WebRtcSpl_DivW32W16(tmp32no1, (ENERGY_DEV_TOL
                        - SUPGAIN_EPC_DT));
                supGain = aecm->supGainErrParamD + tmp16no1;
            }
        } else
        {
            // Likely in double talk. Use default value
            supGain = aecm->supGainErrParamD;
        }
    }

    if (supGain > aecm->supGainOld)
    {
        tmp16no1 = supGain;
    } else
    {
        tmp16no1 = aecm->supGainOld;
    }
    aecm->supGainOld = supGain;
    if (tmp16no1 < aecm->supGain)
    {
        aecm->supGain += (int16_t)((tmp16no1 - aecm->supGain) >> 4);
    } else
    {
        aecm->supGain += (int16_t)((tmp16no1 - aecm->supGain) >> 4);
    }

    // END: Update suppression gain

    return aecm->supGain;
}